

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

uint32_t hydro_random_u32(void)

{
  uint8_t *state_u8;
  uint32_t uVar1;
  long lVar2;
  uchar *dst;
  long *in_FS_OFFSET;
  
  hydro_random_ensure_initialized();
  if (*(byte *)((long)in_FS_OFFSET + -7) < 4) {
    lVar2 = *in_FS_OFFSET;
    state_u8 = (uint8_t *)(lVar2 + -0x40);
    state_u8[0] = '\0';
    state_u8[1] = '\0';
    state_u8[2] = '\0';
    state_u8[3] = '\0';
    state_u8[4] = '\0';
    state_u8[5] = '\0';
    state_u8[6] = '\0';
    state_u8[7] = '\0';
    *(undefined8 *)(lVar2 + -0x38) = 0;
    in_FS_OFFSET[-8] = in_FS_OFFSET[-2];
    in_FS_OFFSET[-2] = in_FS_OFFSET[-2] + 1;
    gimli_core_u8(state_u8,'\0');
    *(undefined1 *)((long)in_FS_OFFSET + -7) = 0x10;
  }
  uVar1 = *(uint32_t *)((*in_FS_OFFSET - (ulong)*(byte *)((long)in_FS_OFFSET + -7)) + -0x30);
  *(byte *)((long)in_FS_OFFSET + -7) = *(byte *)((long)in_FS_OFFSET + -7) - 4;
  return uVar1;
}

Assistant:

uint32_t
hydro_random_u32(void)
{
    uint32_t v;

    hydro_random_ensure_initialized();
    if (hydro_random_context.available < 4) {
        hydro_random_ratchet();
    }
    memcpy(&v, &hydro_random_context.state[gimli_RATE - hydro_random_context.available], 4);
    hydro_random_context.available -= 4;

    return v;
}